

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::lockWhen(Mutex *this,Predicate *predicate)

{
  bool *other;
  byte bVar1;
  Type *func;
  bool *local_60;
  Mutex *local_58;
  undefined1 local_50 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_c__:195:3)>
  _kjDefer204;
  Waiter waiter;
  Predicate *predicate_local;
  Mutex *this_local;
  
  waiter._24_8_ = predicate;
  lock(this,EXCLUSIVE);
  other = &_kjDefer204.canceled;
  Maybe<kj::_::Mutex::Waiter_&>::Maybe((Maybe<kj::_::Mutex::Waiter_&> *)other,(void *)0x0);
  waiter.next.ptr = (Waiter *)this->waitersTail;
  waiter.prev = (Maybe<kj::_::Mutex::Waiter_&> *)waiter._24_8_;
  waiter.predicate._0_4_ = 0;
  Maybe<kj::_::Mutex::Waiter_&>::operator=(this->waitersTail,(Waiter *)other);
  this->waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)other;
  local_60 = other;
  local_58 = this;
  defer<kj::_::Mutex::lockWhen(kj::_::Mutex::Predicate&)::__0>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_c__:195:3)>
              *)local_50,(kj *)&local_60,func);
  bVar1 = (*(code *)**(undefined8 **)waiter._24_8_)();
  if ((bVar1 & 1) == 0) {
    unlock(this,EXCLUSIVE);
    while ((int)waiter.predicate == 0) {
      syscall(0xca,&waiter.predicate,0x80,0,0,0,0);
    }
    assertLockedByCaller(this,EXCLUSIVE);
  }
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++:195:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_c__:195:3)>
               *)local_50);
  return;
}

Assistant:

void Mutex::lockWhen(Predicate& predicate) {
  lock(EXCLUSIVE);

  // Add waiter to list.
  Waiter waiter { nullptr, waitersTail, predicate, 0 };
  *waitersTail = waiter;
  waitersTail = &waiter.next;

  KJ_DEFER({
    // Remove from list.
    *waiter.prev = waiter.next;
    KJ_IF_MAYBE(next, waiter.next) {
      next->prev = waiter.prev;
    } else {
      KJ_DASSERT(waitersTail == &waiter.next);
      waitersTail = waiter.prev;
    }
  });

  if (!predicate.check()) {
    unlock(EXCLUSIVE);

    // Wait for someone to set out futex to 1.
    while (__atomic_load_n(&waiter.futex, __ATOMIC_ACQUIRE) == 0) {
      syscall(SYS_futex, &waiter.futex, FUTEX_WAIT_PRIVATE, 0, NULL, NULL, 0);
    }

    // Ownership of an exclusive lock was transferred to us. We can continue.
#ifdef KJ_DEBUG
    assertLockedByCaller(EXCLUSIVE);
#endif
  }
}